

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_verify.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::ClientContext::VerifyQuery
          (ErrorData *__return_storage_ptr__,ClientContext *this,ClientContextLock *lock,
          string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _Head_base<0UL,_duckdb::StatementVerifier_*,_false> _Var4;
  pointer puVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  type pSVar10;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *puVar11;
  pointer pSVar12;
  type pSVar13;
  type pDVar14;
  MetaTransaction *o;
  pointer pMVar15;
  type pMVar16;
  ExceptionType *pEVar17;
  pointer pSVar18;
  pointer pEVar19;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  oVar20;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *statement_00;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
  *verifier;
  pointer puVar21;
  ErrorData *this_00;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
  *verifier_1;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  parameters_local;
  _Head_base<0UL,_duckdb::StatementVerifier_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::StatementVerifier_*,_false> local_1a8;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> local_1a0;
  ErrorData *local_198;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_190;
  vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_true>
  statement_verifiers;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> local_158;
  ErrorData error;
  undefined1 local_d0 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> explain_q;
  case_insensitive_map_t<idx_t> original_named_param_map;
  
  parameters_local = parameters;
  local_198 = __return_storage_ptr__;
  pSVar10 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator*(statement);
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_head_impl = (StatementVerifier *)0x0;
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->config).query_verification_enabled == true) {
    StatementVerifier::Create((StatementVerifier *)&error,COPIED,pSVar10,parameters);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    StatementVerifier::Create((StatementVerifier *)&error,DESERIALIZED,pSVar10,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    StatementVerifier::Create((StatementVerifier *)&error,UNOPTIMIZED,pSVar10,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    if (parameters_local.ptr ==
        (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
         *)0x0) {
      oVar20.ptr = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                    *)0x0;
    }
    else {
      puVar11 = optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                ::operator->(&parameters_local);
      oVar20 = parameters_local;
      if ((puVar11->_M_h)._M_element_count != 0) goto LAB_019be635;
    }
    StatementVerifier::Create((StatementVerifier *)&error,PREPARED,pSVar10,oVar20);
    uVar6 = error._0_8_;
    _Var4._M_head_impl = local_1a8._M_head_impl;
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    local_1a8._M_head_impl = (StatementVerifier *)uVar6;
    if ((_Var4._M_head_impl != (StatementVerifier *)0x0) &&
       ((*(_Var4._M_head_impl)->_vptr_StatementVerifier[1])(), error._0_8_ != 0)) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
  }
LAB_019be635:
  if ((this->config).verify_fetch_row == true) {
    StatementVerifier::Create
              ((StatementVerifier *)&error,FETCH_ROW_AS_SCAN,pSVar10,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
  }
  if ((this->config).verify_external == true) {
    StatementVerifier::Create((StatementVerifier *)&error,EXTERNAL,pSVar10,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
  }
  make_uniq<duckdb::StatementVerifier,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,duckdb::optional_ptr<std::unordered_map<std::__cxx11::string,duckdb::BoundParameterData,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>>,true>&>
            ((duckdb *)&local_1b0,statement,&parameters_local);
  puVar5 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = statement_verifiers.
                 super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar5; puVar21 = puVar21 + 1
      ) {
    pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                            *)&local_1b0);
    pSVar13 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator*(puVar21);
    StatementVerifier::CheckExpressions(pSVar12,pSVar13);
  }
  pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                          *)&local_1b0);
  StatementVerifier::CheckExpressions(pSVar12);
  (*pSVar10->_vptr_SQLStatement[3])(&local_190,pSVar10);
  bVar1 = (this->config).enable_profiler;
  if (bVar1 == true) {
    (this->config).enable_profiler = false;
  }
  bVar2 = (this->config).enable_optimizer;
  bVar3 = (this->config).force_external;
  pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                          *)&local_1b0);
  oVar20.ptr = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                *)&error;
  error.raw_message.field_2._M_allocated_capacity =
       (size_type)
       ::std::
       _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:99:34)>
       ::_M_invoke;
  error.raw_message._M_string_length =
       (size_type)
       ::std::
       _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:99:34)>
       ::_M_manager;
  error._0_8_ = this;
  error.raw_message._M_dataplus._M_p = (pointer)lock;
  uVar8 = (*pSVar12->_vptr_StatementVerifier[2])(pSVar12,this,query);
  ::std::_Function_base::~_Function_base((_Function_base *)&error);
  if ((char)uVar8 == '\0') {
    pSVar10 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator*((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)&local_190);
    oVar20 = parameters_local;
    StatementVerifier::Create((StatementVerifier *)&error,PARSED,pSVar10,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
  }
  puVar5 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = statement_verifiers.
                 super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar5; puVar21 = puVar21 + 1
      ) {
    pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator->(puVar21);
    error.raw_message.field_2._M_allocated_capacity =
         (size_type)
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:110:31)>
         ::_M_invoke;
    error.raw_message._M_string_length =
         (size_type)
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:110:31)>
         ::_M_manager;
    oVar20.ptr = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                  *)&error;
    error._0_8_ = this;
    error.raw_message._M_dataplus._M_p = (pointer)lock;
    iVar9 = (*pSVar12->_vptr_StatementVerifier[2])(pSVar12,this,query,&error);
    ::std::_Function_base::~_Function_base((_Function_base *)&error);
    uVar8 = (uint)(byte)((byte)uVar8 | (byte)iVar9);
  }
  if ((uVar8 & 1) == 0 && local_1a8._M_head_impl != (StatementVerifier *)0x0) {
    pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                            *)&local_1a8);
    oVar20.ptr = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                  *)&error;
    error.raw_message.field_2._M_allocated_capacity =
         (size_type)
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:121:7)>
         ::_M_invoke;
    error.raw_message._M_string_length =
         (size_type)
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:121:7)>
         ::_M_manager;
    error._0_8_ = this;
    error.raw_message._M_dataplus._M_p = (pointer)lock;
    iVar9 = (*pSVar12->_vptr_StatementVerifier[2])(pSVar12,this,query);
    ::std::_Function_base::~_Function_base((_Function_base *)&error);
    if ((char)iVar9 == '\0') {
      ::std::
      vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
                ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                  *)&statement_verifiers,
                 (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                  *)&local_1a8);
    }
    else {
      pSVar13 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator*((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                             *)&local_1a8);
      if (((pSVar13->materialized_result).
           super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
           .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl !=
           (MaterializedQueryResult *)0x0) &&
         (pMVar16 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                    ::operator*(&pSVar13->materialized_result),
         (pMVar16->super_QueryResult).super_BaseQueryResult.success == false)) {
        this_00 = &(pMVar16->super_QueryResult).super_BaseQueryResult.error;
        pEVar17 = ErrorData::Type(this_00);
        if (*pEVar17 == INTERNAL) {
          ::std::__cxx11::string::string
                    ((string *)&error,anon_var_dwarf_3b2a81b + 9,
                     (allocator *)&original_named_param_map);
          ErrorData::Throw(this_00,(string *)&error);
        }
      }
    }
  }
  else {
    pDVar14 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->db);
    if (((pDVar14->db_validity).is_invalidated._M_base._M_i & 1U) != 0) {
LAB_019be8dc:
      pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                              *)&local_1b0);
      pMVar15 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                ::operator->(&pSVar12->materialized_result);
      ErrorData::ErrorData(local_198,&(pMVar15->super_QueryResult).super_BaseQueryResult.error);
      goto LAB_019beba5;
    }
    if ((this->transaction).current_transaction.
        super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
        .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl !=
        (MetaTransaction *)0x0) {
      o = TransactionContext::ActiveTransaction(&this->transaction);
      bVar7 = ValidChecker::IsInvalidated<duckdb::MetaTransaction>(o);
      if (bVar7) goto LAB_019be8dc;
    }
  }
  (this->config).enable_optimizer = bVar2;
  statement_00 = (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)CONCAT71((int7)((ulong)oVar20.ptr >> 8),bVar3);
  (this->config).force_external = bVar3;
  pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                          *)&local_1b0);
  pMVar15 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
            ::operator->(&pSVar12->materialized_result);
  if ((pMVar15->super_QueryResult).super_BaseQueryResult.success == true) {
    ::std::operator+(&explain_q,"EXPLAIN ",query);
    pSVar18 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                          *)&local_190);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&original_named_param_map._M_h,&(pSVar18->named_param_map)._M_h);
    make_uniq<duckdb::ExplainStatement,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
              ((duckdb *)&local_1a0,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               &local_190);
    pEVar19 = unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true>
              ::operator->((unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true>
                            *)&local_1a0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(pEVar19->super_SQLStatement).named_param_map._M_h,&original_named_param_map._M_h);
    local_158._M_head_impl = local_1a0._M_head_impl;
    local_1a0._M_head_impl = (ExplainStatement *)0x0;
    RunStatementInternal
              ((ClientContext *)local_d0,(ClientContextLock *)this,(string *)lock,statement_00,
               SUB81(&local_158,0),
               (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                )0x0,SUB81(parameters_local.ptr,0));
    if ((element_type *)local_d0._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_d0._0_8_)->__weak_this_)
                  .internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_d0._0_8_ = (element_type *)0x0;
    if (local_158._M_head_impl != (ExplainStatement *)0x0) {
      (*((local_158._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    if (local_1a0._M_head_impl != (ExplainStatement *)0x0) {
      (*((local_1a0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&original_named_param_map._M_h);
    ::std::__cxx11::string::~string((string *)&explain_q);
  }
  puVar5 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar1 != false) {
    (this->config).enable_profiler = true;
  }
  for (puVar21 = statement_verifiers.
                 super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar5; puVar21 = puVar21 + 1
      ) {
    pSVar12 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator->((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                            *)&local_1b0);
    pSVar13 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator*(puVar21);
    StatementVerifier::CompareResults_abi_cxx11_((string *)&error,pSVar12,pSVar13);
    if (error.raw_message._M_dataplus._M_p != (pointer)0x0) {
      ErrorData::ErrorData(local_198,(string *)&error);
      ::std::__cxx11::string::~string((string *)&error);
      goto LAB_019beba5;
    }
    ::std::__cxx11::string::~string((string *)&error);
  }
  ErrorData::ErrorData(local_198);
LAB_019beba5:
  if (local_190._M_head_impl != (SQLStatement *)0x0) {
    (*(local_190._M_head_impl)->_vptr_SQLStatement[1])();
  }
  if (local_1b0._M_head_impl != (StatementVerifier *)0x0) {
    (*(local_1b0._M_head_impl)->_vptr_StatementVerifier[1])();
  }
  if (local_1a8._M_head_impl != (StatementVerifier *)0x0) {
    (*(local_1a8._M_head_impl)->_vptr_StatementVerifier[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ::~vector(&statement_verifiers.
             super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           );
  return local_198;
}

Assistant:

ErrorData ClientContext::VerifyQuery(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                     optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	D_ASSERT(statement->type == StatementType::SELECT_STATEMENT);
	// Aggressive query verification

#ifdef DUCKDB_RUN_SLOW_VERIFIERS
	bool run_slow_verifiers = true;
#else
	bool run_slow_verifiers = false;
#endif

	// The purpose of this function is to test correctness of otherwise hard to test features:
	// Copy() of statements and expressions
	// Serialize()/Deserialize() of expressions
	// Hash() of expressions
	// Equality() of statements and expressions
	// ToString() of statements and expressions
	// Correctness of plans both with and without optimizers

	const auto &stmt = *statement;
	vector<unique_ptr<StatementVerifier>> statement_verifiers;
	unique_ptr<StatementVerifier> prepared_statement_verifier;

	// Base Statement verifiers: these are the verifiers we enable for regular builds
	if (config.query_verification_enabled) {
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::COPIED, stmt, parameters));
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::DESERIALIZED, stmt, parameters));
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::UNOPTIMIZED, stmt, parameters));

		// FIXME: Prepared parameter verifier is broken for queries with parameters
		if (!parameters || parameters->empty()) {
			prepared_statement_verifier = StatementVerifier::Create(VerificationType::PREPARED, stmt, parameters);
		}
	}

	// This verifier is enabled explicitly OR by enabling run_slow_verifiers
	if (config.verify_fetch_row || (run_slow_verifiers && config.query_verification_enabled)) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::FETCH_ROW_AS_SCAN, stmt, parameters));
	}

	// For the DEBUG_ASYNC build we enable this extra verifier
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (config.query_verification_enabled) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::NO_OPERATOR_CACHING, stmt, parameters));
	}
#endif

	// Verify external always needs to be explicitly enabled and is never part of default verifier set
	if (config.verify_external) {
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::EXTERNAL, stmt, parameters));
	}

	auto original = make_uniq<StatementVerifier>(std::move(statement), parameters);
	for (auto &verifier : statement_verifiers) {
		original->CheckExpressions(*verifier);
	}
	original->CheckExpressions();

	// See below
	auto statement_copy_for_explain = stmt.Copy();

	// Save settings
	bool optimizer_enabled = config.enable_optimizer;
	bool profiling_is_enabled = config.enable_profiler;
	bool force_external = config.force_external;

	// Disable profiling if it is enabled
	if (profiling_is_enabled) {
		config.enable_profiler = false;
	}

	// Execute the original statement
	bool any_failed = original->Run(*this, query,
	                                [&](const string &q, unique_ptr<SQLStatement> s,
	                                    optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
		                                return RunStatementInternal(lock, q, std::move(s), false, params, false);
	                                });
	if (!any_failed) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::PARSED, *statement_copy_for_explain, parameters));
	}
	// Execute the verifiers
	for (auto &verifier : statement_verifiers) {
		bool failed = verifier->Run(*this, query,
		                            [&](const string &q, unique_ptr<SQLStatement> s,
		                                optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
			                            return RunStatementInternal(lock, q, std::move(s), false, params, false);
		                            });
		any_failed = any_failed || failed;
	}

	if (!any_failed && prepared_statement_verifier) {
		// If none failed, we execute the prepared statement verifier
		bool failed = prepared_statement_verifier->Run(
		    *this, query,
		    [&](const string &q, unique_ptr<SQLStatement> s,
		        optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
			    return RunStatementInternal(lock, q, std::move(s), false, params, false);
		    });
		if (!failed) {
			// PreparedStatementVerifier fails if it runs into a ParameterNotAllowedException, which is OK
			statement_verifiers.push_back(std::move(prepared_statement_verifier));
		} else {
			// If it does fail, let's make sure it's not an internal exception
			ThrowIfExceptionIsInternal(*prepared_statement_verifier);
		}
	} else {
		if (ValidChecker::IsInvalidated(*db)) {
			return original->materialized_result->GetErrorObject();
		}
		if (transaction.HasActiveTransaction() && ValidChecker::IsInvalidated(ActiveTransaction())) {
			return original->materialized_result->GetErrorObject();
		}
	}

	// Restore config setting
	config.enable_optimizer = optimizer_enabled;
	config.force_external = force_external;

	// Check explain, only if q does not already contain EXPLAIN
	if (original->materialized_result->success) {
		auto explain_q = "EXPLAIN " + query;
		auto original_named_param_map = statement_copy_for_explain->named_param_map;
		auto explain_stmt = make_uniq<ExplainStatement>(std::move(statement_copy_for_explain));
		explain_stmt->named_param_map = original_named_param_map;
		try {
			RunStatementInternal(lock, explain_q, std::move(explain_stmt), false, parameters, false);
		} catch (std::exception &ex) { // LCOV_EXCL_START
			ErrorData error(ex);
			interrupted = false;
			return ErrorData("EXPLAIN failed but query did not (" + error.RawMessage() + ")");
		} // LCOV_EXCL_STOP

#ifdef DUCKDB_VERIFY_BOX_RENDERER
		// this is pretty slow, so disabled by default
		// test the box renderer on the result
		// we mostly care that this does not crash
		RandomEngine random;
		BoxRendererConfig config;
		// test with a random width
		config.max_width = random.NextRandomInteger() % 500;
		BoxRenderer renderer(config);
		renderer.ToString(*this, original->materialized_result->names, original->materialized_result->Collection());
#endif
	}

	// Restore profiler setting
	if (profiling_is_enabled) {
		config.enable_profiler = true;
	}

	// Now compare the results
	// The results of all runs should be identical
	for (auto &verifier : statement_verifiers) {
		auto result = original->CompareResults(*verifier);
		if (!result.empty()) {
			return ErrorData(result);
		}
	}

	return ErrorData();
}